

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine.cpp
# Opt level: O0

QString * QFileSystemEngine::resolveUserName(QFileSystemEntry *entry,QFileSystemMetaData *metaData)

{
  long lVar1;
  bool bVar2;
  QFileSystemMetaData *in_RDX;
  QFlags<QFileSystemMetaData::MetaDataFlag> *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QFileSystemMetaData *in_stack_00000040;
  QFileSystemEntry *in_stack_00000048;
  MetaDataFlags in_stack_0000012c;
  undefined4 in_stack_ffffffffffffffa8;
  MetaDataFlag in_stack_ffffffffffffffac;
  QFlags<QFileSystemMetaData::MetaDataFlag> *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  QFlagsStorage<QFileSystemMetaData::MetaDataFlag> flags;
  QString *pQVar3;
  uint userId;
  
  flags.i = (Int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RDI;
  QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  userId = (uint)((ulong)pQVar3 >> 0x20);
  bVar2 = QFileSystemMetaData::hasFlags
                    ((QFileSystemMetaData *)
                     CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     (MetaDataFlags)flags.i);
  if (!bVar2) {
    QFlags<QFileSystemMetaData::MetaDataFlag>::QFlags(in_RSI,in_stack_ffffffffffffffac);
    fillMetaData(in_stack_00000048,in_stack_00000040,in_stack_0000012c);
  }
  bVar2 = QFileSystemMetaData::exists((QFileSystemMetaData *)0x2b78ed);
  if (bVar2) {
    QFileSystemMetaData::userId(in_RDX);
    resolveUserName(userId);
  }
  else {
    QString::QString((QString *)0x2b78fb);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QFileSystemEngine::resolveUserName(const QFileSystemEntry &entry, QFileSystemMetaData &metaData)
{
#if defined(Q_OS_WIN)
    Q_UNUSED(metaData);
    return QFileSystemEngine::owner(entry, QAbstractFileEngine::OwnerUser);
#else //(Q_OS_UNIX)
    if (!metaData.hasFlags(QFileSystemMetaData::UserId))
        QFileSystemEngine::fillMetaData(entry, metaData, QFileSystemMetaData::UserId);
    if (!metaData.exists())
        return QString();
    return resolveUserName(metaData.userId());
#endif
}